

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::InputFile::Data::readPixels
          (Data *this,FrameBuffer *frameBuffer,int scanLine1,int scanLine2)

{
  int iVar1;
  lock_guard<std::mutex> lock;
  
  if ((this->_compositor)._M_t.
      super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      ._M_t.
      super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
      .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl ==
      (CompositeDeepScanLine *)0x0) {
    if (this->_storage != EXR_STORAGE_TILED) {
      ScanLineInputFile::readPixels
                ((this->_sFile)._M_t.
                 super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
                 .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl,
                 frameBuffer,scanLine1,scanLine2);
      return;
    }
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar1 != 0) goto LAB_001864dc;
    lockedSetFrameBuffer(this,frameBuffer);
    bufferedReadPixels(this,scanLine1,scanLine2);
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar1 != 0) {
LAB_001864dc:
      std::__throw_system_error(iVar1);
    }
    CompositeDeepScanLine::setFrameBuffer
              ((this->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl,
               frameBuffer);
    CompositeDeepScanLine::readPixels
              ((this->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl,
               scanLine1,scanLine2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void
InputFile::Data::readPixels (
    const FrameBuffer& frameBuffer, int scanLine1, int scanLine2)
{
    if (_compositor)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_mx);
#endif
        _compositor->setFrameBuffer (frameBuffer);
        _compositor->readPixels (scanLine1, scanLine2);
    }
    else if (_storage == EXR_STORAGE_TILED)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_mx);
#endif

        lockedSetFrameBuffer (frameBuffer);
        bufferedReadPixels (scanLine1, scanLine2);
    }
    else { _sFile->readPixels (frameBuffer, scanLine1, scanLine2); }
}